

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ty.hpp
# Opt level: O2

void __thiscall mir::types::PtrTy::PtrTy(PtrTy *this,SharedTyPtr *item)

{
  (this->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dae70;
  std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->item).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,
             &item->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>);
  reduce_array(this);
  return;
}

Assistant:

PtrTy(SharedTyPtr item) : item(item) {
    // reduce "to" type to array item if it's an array
    reduce_array();
  }